

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall
soplex::SLUFactor<double>::solveRight
          (SLUFactor<double> *this,VectorBase<double> *x,VectorBase<double> *b)

{
  double *vec;
  CLUFactor<double> *in_RDI;
  VectorBase<double> *in_stack_ffffffffffffffc8;
  VectorBase<double> *in_stack_ffffffffffffffd0;
  pointer *rhs;
  
  (**(code **)(*(long *)in_RDI[1].u.row.idx + 0x18))();
  VectorBase<double>::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  VectorBase<double>::clear((VectorBase<double> *)in_RDI);
  rhs = (pointer *)&in_RDI->initMaxabs;
  vec = VectorBase<double>::get_ptr((VectorBase<double> *)0x2501c2);
  VectorBase<double>::get_ptr((VectorBase<double> *)0x2501d8);
  CLUFactor<double>::solveRight(in_RDI,vec,(double *)rhs);
  *(int *)((long)&in_RDI[1].u.row.start + 4) = *(int *)((long)&in_RDI[1].u.row.start + 4) + 1;
  (**(code **)(*(long *)in_RDI[1].u.row.idx + 0x20))();
  return;
}

Assistant:

void SLUFactor<R>::solveRight(VectorBase<R>& x, const VectorBase<R>& b) //const
{

   this->solveTime->start();

   this->vec = b;
   x.clear();
   CLUFactor<R>::solveRight(x.get_ptr(), vec.get_ptr());

   solveCount++;
   solveTime->stop();
}